

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

stbtt_int32
stbtt__CompareUTF8toUTF16_bigendian_prefix
          (stbtt_uint8 *s1,stbtt_int32 len1,stbtt_uint8 *s2,stbtt_int32 len2)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  iVar4 = 0;
  do {
    if (len2 == 0) {
      return iVar4;
    }
    bVar1 = *s2;
    bVar2 = s2[1];
    uVar3 = CONCAT11(bVar1,bVar2);
    uVar5 = (uint)uVar3;
    lVar6 = (long)iVar4;
    if (uVar5 < 0x80) {
      if (len1 <= iVar4) {
        return -1;
      }
      if (uVar5 != s1[lVar6]) {
        return -1;
      }
      iVar4 = iVar4 + 1;
    }
    else if (bVar1 < 8) {
      if (len1 <= (int)(lVar6 + 1)) {
        return -1;
      }
      if ((ushort)(uVar3 >> 6 | 0xc0) != (ushort)s1[lVar6]) {
        return -1;
      }
      if ((bVar2 & 0x3f | 0x80) != s1[lVar6 + 1]) {
        return -1;
      }
      iVar4 = iVar4 + 2;
    }
    else if ((bVar1 & 0xfc) == 0xd8) {
      if (len1 <= (int)(lVar6 + 3)) {
        return -1;
      }
      uVar5 = uVar5 * 0x400 + (uint)CONCAT11(s2[2],s2[3]) + 0xfca02400;
      if ((uVar5 >> 0x12) + 0xf0 != (uint)s1[lVar6]) {
        return -1;
      }
      if ((uVar5 >> 0xc & 0x3f | 0x80) != (uint)s1[lVar6 + 1]) {
        return -1;
      }
      if ((uVar5 >> 6 & 0x3f | 0x80) != (uint)s1[lVar6 + 2]) {
        return -1;
      }
      if ((s2[3] & 0x3f | 0x80) != s1[lVar6 + 3]) {
        return -1;
      }
      s2 = s2 + 2;
      iVar4 = iVar4 + 4;
      len2 = len2 + -2;
    }
    else {
      if ((bVar1 & 0xfc) == 0xdc) {
        return -1;
      }
      if (len1 <= (int)(lVar6 + 2)) {
        return -1;
      }
      if ((byte)(bVar1 >> 4 | 0xe0) != s1[lVar6]) {
        return -1;
      }
      if ((uVar3 >> 6 & 0x3f | 0x80) != (ushort)s1[lVar6 + 1]) {
        return -1;
      }
      if ((bVar2 & 0x3f | 0x80) != s1[lVar6 + 2]) {
        return -1;
      }
      iVar4 = iVar4 + 3;
    }
    s2 = s2 + 2;
    len2 = len2 + -2;
  } while( true );
}

Assistant:

static stbtt_int32 stbtt__CompareUTF8toUTF16_bigendian_prefix(stbtt_uint8 *s1, stbtt_int32 len1, stbtt_uint8 *s2, stbtt_int32 len2)
{
   stbtt_int32 i=0;

   // convert utf16 to utf8 and compare the results while converting
   while (len2) {
      stbtt_uint16 ch = s2[0]*256 + s2[1];
      if (ch < 0x80) {
         if (i >= len1) return -1;
         if (s1[i++] != ch) return -1;
      } else if (ch < 0x800) {
         if (i+1 >= len1) return -1;
         if (s1[i++] != 0xc0 + (ch >> 6)) return -1;
         if (s1[i++] != 0x80 + (ch & 0x3f)) return -1;
      } else if (ch >= 0xd800 && ch < 0xdc00) {
         stbtt_uint32 c;
         stbtt_uint16 ch2 = s2[2]*256 + s2[3];
         if (i+3 >= len1) return -1;
         c = ((ch - 0xd800) << 10) + (ch2 - 0xdc00) + 0x10000;
         if (s1[i++] != 0xf0 + (c >> 18)) return -1;
         if (s1[i++] != 0x80 + ((c >> 12) & 0x3f)) return -1;
         if (s1[i++] != 0x80 + ((c >>  6) & 0x3f)) return -1;
         if (s1[i++] != 0x80 + ((c      ) & 0x3f)) return -1;
         s2 += 2; // plus another 2 below
         len2 -= 2;
      } else if (ch >= 0xdc00 && ch < 0xe000) {
         return -1;
      } else {
         if (i+2 >= len1) return -1;
         if (s1[i++] != 0xe0 + (ch >> 12)) return -1;
         if (s1[i++] != 0x80 + ((ch >> 6) & 0x3f)) return -1;
         if (s1[i++] != 0x80 + ((ch     ) & 0x3f)) return -1;
      }
      s2 += 2;
      len2 -= 2;
   }
   return i;
}